

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall parser::loadActionMap(parser *this)

{
  long lVar1;
  actions local_2e0 [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_2a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_278;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_250;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_228;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_200;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_1d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_188;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  local_48;
  
  local_2e0[0xf] = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[3],_actions,_true>(&local_2a0,(char (*) [3])"go",local_2e0 + 0xf);
  local_2e0[0xe] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[6],_actions,_true>(&local_278,(char (*) [6])"throw",local_2e0 + 0xe);
  local_2e0[0xd] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[5],_actions,_true>(&local_250,(char (*) [5])"look",local_2e0 + 0xd);
  local_2e0[0xc] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[8],_actions,_true>(&local_228,(char (*) [8])"examine",local_2e0 + 0xc);
  local_2e0[0xb] = 3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[5],_actions,_true>(&local_200,(char (*) [5])"rest",local_2e0 + 0xb);
  local_2e0[10] = 4;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[6],_actions,_true>(&local_1d8,(char (*) [6])"touch",local_2e0 + 10);
  local_2e0[9] = 5;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[7],_actions,_true>(&local_1b0,(char (*) [7])"pickup",local_2e0 + 9);
  local_2e0[8] = 5;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[5],_actions,_true>(&local_188,(char (*) [5])"pick",local_2e0 + 8);
  local_2e0[7] = 6;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[5],_actions,_true>(&local_160,(char (*) [5])"drop",local_2e0 + 7);
  local_2e0[6] = 7;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[4],_actions,_true>(&local_138,(char (*) [4])"use",local_2e0 + 6);
  local_2e0[5] = 8;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[5],_actions,_true>(&local_110,(char (*) [5])"open",local_2e0 + 5);
  local_2e0[4] = 8;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[6],_actions,_true>(&local_e8,(char (*) [6])"close",local_2e0 + 4);
  local_2e0[3] = 0xb;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[5],_actions,_true>(&local_c0,(char (*) [5])"help",local_2e0 + 3);
  local_2e0[2] = 10;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[1],_actions,_true>(&local_98,(char (*) [1])0x125de5,local_2e0 + 2);
  local_2e0[1] = 0xc;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[5],_actions,_true>(&local_70,(char (*) [5])"quit",local_2e0 + 1);
  local_2e0[0] = EXIT;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
  ::pair<const_char_(&)[5],_actions,_true>(&local_48,(char (*) [5])"exit",local_2e0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,actions>,std::_Select1st<std::pair<std::__cxx11::string_const,actions>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,actions>>>
  ::_M_assign_unique<std::pair<std::__cxx11::string_const,actions>const*>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,actions>,std::_Select1st<std::pair<std::__cxx11::string_const,actions>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,actions>>>
              *)&this->actionMap,&local_2a0,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_actions>
              *)&stack0xffffffffffffffe0);
  lVar1 = 600;
  do {
    std::__cxx11::string::~string((string *)((long)&local_2a0.first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x28);
  return;
}

Assistant:

void parser::loadActionMap() {
    actionMap = {
            {"go", GO},
            {"throw", THROW},
            {"look", LOOK},
            {"examine", LOOK},
            {"rest", REST},
            {"touch", TOUCH},
            {"pickup", PICK},
            {"pick", PICK},
            {"drop", DROP},
            {"use", USE},
            {"open", OPEN},
            {"close", OPEN},
            {"help", HELP},
            {"", NO_ACTION},
            {"quit", EXIT},
            {"exit", EXIT}
    };
}